

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O1

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  byte bVar1;
  size_type sVar2;
  string *psVar3;
  char cVar4;
  LogMessage *pLVar5;
  pointer pcVar6;
  int iVar7;
  SubstituteArg *pSVar8;
  int iVar9;
  ulong uVar10;
  uint value;
  int iVar11;
  long lVar12;
  char *__dest;
  bool bVar13;
  SubstituteArg *args_array [11];
  LogFinisher local_126;
  allocator local_125;
  int local_124;
  string local_120;
  string local_100;
  string *local_e0;
  SubstituteArg *local_d8;
  ulong local_d0;
  SubstituteArg *local_c8 [5];
  SubstituteArg *pSStack_a0;
  SubstituteArg *local_98;
  SubstituteArg *pSStack_90;
  SubstituteArg *local_88;
  SubstituteArg *pSStack_80;
  undefined8 local_78;
  LogMessage local_68;
  
  local_c8[0] = arg0;
  local_c8[1] = arg1;
  local_c8[2] = arg2;
  local_c8[3] = arg3;
  local_c8[4] = arg4;
  pSStack_a0 = arg5;
  local_98 = arg6;
  pSStack_90 = arg7;
  local_88 = arg8;
  pSStack_80 = arg9;
  local_78 = 0;
  cVar4 = *format;
  bVar13 = cVar4 != '\0';
  local_e0 = output;
  local_d8 = arg0;
  if (cVar4 == '\0') {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    lVar12 = 0;
    do {
      iVar11 = (int)lVar12;
      iVar9 = (int)uVar10;
      if (cVar4 == '$') {
        bVar1 = format[(long)iVar11 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          value = bVar1 - 0x30;
          iVar7 = local_c8[value]->size_;
          if (iVar7 == -1) {
            local_124 = iVar7;
            local_d0 = uVar10;
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/substitute.cc"
                       ,0x56);
            pLVar5 = internal::LogMessage::operator<<
                               (&local_68,"strings::Substitute format string invalid: asked for \"$"
                               );
            pLVar5 = internal::LogMessage::operator<<(pLVar5,value);
            pLVar5 = internal::LogMessage::operator<<(pLVar5,"\", but only ");
            lVar12 = 0;
            pSVar8 = local_d8;
            do {
              if (pSVar8->size_ == -1) break;
              pSVar8 = local_c8[lVar12 + 1];
              lVar12 = lVar12 + 1;
            } while (pSVar8 != (SubstituteArg *)0x0);
            pLVar5 = internal::LogMessage::operator<<(pLVar5,(int)lVar12);
            pLVar5 = internal::LogMessage::operator<<
                               (pLVar5," args were given.  Full format string was: \"");
            std::__cxx11::string::string((string *)&local_120,format,&local_125);
            CEscape(&local_100,&local_120);
            pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_100);
            pLVar5 = internal::LogMessage::operator<<(pLVar5,"\".");
            internal::LogFinisher::operator=(&local_126,pLVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            internal::LogMessage::~LogMessage(&local_68);
            uVar10 = local_d0;
            iVar7 = local_124;
          }
          else {
            uVar10 = (ulong)(uint)(iVar9 + iVar7);
            iVar11 = iVar11 + 1;
          }
          if (iVar7 == -1) break;
        }
        else {
          if (bVar1 != 0x24) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/substitute.cc"
                       ,99);
            pLVar5 = internal::LogMessage::operator<<
                               (&local_68,"Invalid strings::Substitute() format string: \"");
            std::__cxx11::string::string((string *)&local_120,format,&local_125);
            CEscape(&local_100,&local_120);
            pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_100);
            pLVar5 = internal::LogMessage::operator<<(pLVar5,"\".");
            internal::LogFinisher::operator=(&local_126,pLVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            internal::LogMessage::~LogMessage(&local_68);
            break;
          }
          uVar10 = (ulong)(iVar9 + 1);
          iVar11 = iVar11 + 1;
        }
      }
      else {
        uVar10 = (ulong)(iVar9 + 1);
      }
      cVar4 = format[(long)iVar11 + 1];
      lVar12 = (long)iVar11 + 1;
      bVar13 = cVar4 != '\0';
    } while (bVar13);
  }
  psVar3 = local_e0;
  if ((!bVar13) && ((int)uVar10 != 0)) {
    sVar2 = local_e0->_M_string_length;
    iVar11 = 0;
    std::__cxx11::string::resize((ulong)local_e0,(char)uVar10 + (char)sVar2);
    if (psVar3->_M_string_length == 0) {
      pcVar6 = (pointer)0x0;
    }
    else {
      pcVar6 = (psVar3->_M_dataplus)._M_p;
    }
    __dest = pcVar6 + (int)sVar2;
    do {
      cVar4 = format[iVar11];
      if (cVar4 == '$') {
        bVar1 = format[(long)iVar11 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          pSVar8 = local_c8[bVar1 & 0xf];
          memcpy(__dest,pSVar8->text_,(long)pSVar8->size_);
          __dest = __dest + pSVar8->size_;
          iVar11 = iVar11 + 1;
        }
        else if (bVar1 == 0x24) {
          *__dest = '$';
          __dest = __dest + 1;
          iVar11 = iVar11 + 1;
        }
      }
      else {
        if (cVar4 == '\0') {
          return;
        }
        *__dest = cVar4;
        __dest = __dest + 1;
      }
      iVar11 = iVar11 + 1;
    } while( true );
  }
  return;
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, nullptr
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}